

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::set_key_ref(Tree *this,size_t node,csubstr ref)

{
  csubstr ref_00;
  Location loc;
  bool bVar1;
  error_flags eVar2;
  NodeData *pNVar3;
  undefined8 in_RCX;
  size_t in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  NodeData *n;
  size_t in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  Location *in_stack_ffffffffffffff60;
  Tree *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff98;
  Tree *in_stack_ffffffffffffffa0;
  char *local_58;
  Location *in_stack_ffffffffffffffb0;
  Tree *in_stack_ffffffffffffffb8;
  
  pNVar3 = _p(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
  if (((pNVar3->m_type).type & (KEYANCH|KEY)) == (KEYANCH|KEY)) {
    eVar2 = get_error_flags();
    in_stack_ffffffffffffff68 = in_stack_ffffffffffffffb8;
    if (((eVar2 & 1) != 0) &&
       (bVar1 = is_debugger_attached(), in_stack_ffffffffffffff68 = in_stack_ffffffffffffffb8, bVar1
       )) {
      trap_instruction();
      in_stack_ffffffffffffff68 = in_stack_ffffffffffffffb8;
    }
    Location::Location(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50
                       ,in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff60 = in_stack_ffffffffffffffb0;
    loc.super_LineCol.line = (size_t)in_stack_ffffffffffffff68;
    loc.super_LineCol.offset = (size_t)in_stack_ffffffffffffff60;
    loc.super_LineCol.col = in_RSI;
    loc.name.str = (char *)in_RDI;
    loc.name.len = in_RDX;
    error<37ul>((char (*) [37])in_stack_ffffffffffffffa0,loc);
    in_stack_ffffffffffffff58 = local_58;
  }
  pNVar3 = _p(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
  ref_00.len = (size_t)in_stack_ffffffffffffffa0;
  ref_00.str = in_stack_ffffffffffffff98;
  NodeScalar::set_ref_maybe_replacing_scalar
            ((NodeScalar *)pNVar3,ref_00,SUB81((ulong)in_RCX >> 0x38,0));
  _add_flags(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60,
             (type_bits)in_stack_ffffffffffffff58);
  return;
}

Assistant:

void set_key_ref   (size_t node, csubstr ref   ) { RYML_ASSERT( ! has_key_anchor(node)); NodeData* C4_RESTRICT n = _p(node); n->m_key.set_ref_maybe_replacing_scalar(ref, n->m_type.has_key()); _add_flags(node, KEY|KEYREF); }